

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch_memory_mapping.c
# Opt level: O0

void walk_pde(MemoryMappingList *list,AddressSpace *as,hwaddr pde_start_addr,int32_t a20_mask,
             target_ulong start_line_addr)

{
  _Bool _Var1;
  uint64_t uVar2;
  ulong start_line_addr_00;
  MemTxAttrs local_68;
  uint local_64;
  int i;
  target_ulong start_vaddr;
  target_ulong line_addr;
  uint64_t pde;
  hwaddr start_paddr;
  hwaddr pte_start_addr;
  hwaddr pde_addr;
  target_ulong start_line_addr_local;
  int32_t a20_mask_local;
  hwaddr pde_start_addr_local;
  AddressSpace *as_local;
  MemoryMappingList *list_local;
  
  for (local_64 = 0; (int)local_64 < 0x200; local_64 = local_64 + 1) {
    local_68 = (MemTxAttrs)((uint)local_68 & 0xff800000 | 1);
    uVar2 = address_space_ldq_x86_64
                      ((uc_struct_conflict *)as->uc,as,
                       pde_start_addr + (long)(int)(local_64 << 3) & (long)a20_mask,local_68,
                       (MemTxResult *)0x0);
    if ((uVar2 & 1) != 0) {
      start_line_addr_00 = start_line_addr | (long)(int)((local_64 & 0x1ff) << 0x15);
      if ((uVar2 & 0x80) == 0) {
        walk_pte(list,as,uVar2 & 0xffffffffff000 & (long)a20_mask,a20_mask,start_line_addr_00);
      }
      else {
        _Var1 = cpu_physical_memory_is_io_x86_64(as,uVar2 & 0x7fffffffffe00000);
        if (!_Var1) {
          memory_mapping_list_add_merge_sorted_x86_64
                    (list,uVar2 & 0x7fffffffffe00000,start_line_addr_00,0x200000);
        }
      }
    }
  }
  return;
}

Assistant:

static void walk_pde(MemoryMappingList *list, AddressSpace *as,
                     hwaddr pde_start_addr,
                     int32_t a20_mask, target_ulong start_line_addr)
{
    hwaddr pde_addr, pte_start_addr, start_paddr;
    uint64_t pde;
    target_ulong line_addr, start_vaddr;
    int i;

    for (i = 0; i < 512; i++) {
        pde_addr = (pde_start_addr + i * 8) & a20_mask;
#ifdef UNICORN_ARCH_POSTFIX
        pde = glue(address_space_ldq, UNICORN_ARCH_POSTFIX)(as->uc, as, pde_addr, MEMTXATTRS_UNSPECIFIED, NULL);
#else
        pde = address_space_ldq(as->uc, as, pde_addr, MEMTXATTRS_UNSPECIFIED, NULL);
#endif
        if (!(pde & PG_PRESENT_MASK)) {
            /* not present */
            continue;
        }

        line_addr = start_line_addr | ((i & 0x1ff) << 21);
        if (pde & PG_PSE_MASK) {
            /* 2 MB page */
            start_paddr = (pde & ~0x1fffff) & ~(0x1ULL << 63);
            if (cpu_physical_memory_is_io(as, start_paddr)) {
                /* I/O region */
                continue;
            }
            start_vaddr = line_addr;
            memory_mapping_list_add_merge_sorted(list, start_paddr,
                                                 start_vaddr, 1 << 21);
            continue;
        }

        pte_start_addr = (pde & PLM4_ADDR_MASK) & a20_mask;
        walk_pte(list, as, pte_start_addr, a20_mask, line_addr);
    }
}